

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void handleSelectionRequest(XEvent *event)

{
  Atom *pAVar1;
  Atom AVar2;
  Atom AVar3;
  undefined8 uVar4;
  Display *pDVar5;
  char *pcVar6;
  unsigned_long uVar7;
  long lVar8;
  Atom AVar9;
  Window WVar10;
  ulong uVar11;
  undefined8 uStackY_160;
  Atom *pAVar12;
  size_t sVar13;
  Atom formats [3];
  Atom targets [5];
  undefined4 local_f0 [6];
  Display *local_d8;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  Time local_c0;
  Atom local_b8;
  Window local_b0;
  
  AVar9 = 0;
  uVar11 = 0;
  memset(local_f0,0,0xc0);
  pAVar12 = (Atom *)_glfw.x11.clipboardString;
  pDVar5 = _glfw.x11.display;
  formats[0] = _glfw.x11.UTF8_STRING;
  formats[1] = _glfw.x11.COMPOUND_STRING;
  formats[2] = 0x1f;
  AVar2 = (event->xselectionrequest).property;
  if (AVar2 == 0) goto LAB_0011cdfb;
  AVar3 = (event->xselectionrequest).target;
  if (AVar3 == _glfw.x11.TARGETS) {
    pAVar12 = targets;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = _glfw.x11.COMPOUND_STRING;
    targets[4] = 0x1f;
    WVar10 = (event->xkey).root;
    uStackY_160 = 0x20;
    sVar13 = 5;
    AVar9 = 4;
    targets[0] = AVar3;
LAB_0011ccaa:
    XChangeProperty(pDVar5,WVar10,AVar2,AVar9,uStackY_160,0,pAVar12,sVar13);
  }
  else {
    if (AVar3 != _glfw.x11.MULTIPLE) {
      if (AVar3 == _glfw.x11.SAVE_TARGETS) {
        WVar10 = (event->xkey).root;
        sVar13 = uVar11 & 0xffffffff00000000;
        pAVar12 = (Atom *)0x0;
        uStackY_160 = 0x20;
        AVar9 = _glfw.x11.NULL_;
      }
      else {
        AVar9 = 0;
        lVar8 = 0;
        do {
          if (lVar8 == 3) goto LAB_0011cdfb;
          pAVar1 = formats + lVar8;
          lVar8 = lVar8 + 1;
        } while (AVar3 != *pAVar1);
        WVar10 = (event->xkey).root;
        sVar13 = strlen(_glfw.x11.clipboardString);
        uStackY_160 = 8;
        AVar9 = AVar3;
      }
      goto LAB_0011ccaa;
    }
    uVar7 = _glfwGetWindowPropertyX11
                      ((event->xkey).root,AVar2,_glfw.x11.ATOM_PAIR,(uchar **)targets);
    for (uVar11 = 0; pcVar6 = _glfw.x11.clipboardString, pDVar5 = _glfw.x11.display, uVar11 < uVar7;
        uVar11 = uVar11 + 2) {
      AVar2 = *(Atom *)(targets[0] + uVar11 * 8);
      lVar8 = 0;
      do {
        if (lVar8 == 3) {
          *(undefined8 *)(targets[0] + 8 + uVar11 * 8) = 0;
          goto LAB_0011cd78;
        }
        pAVar12 = formats + lVar8;
        lVar8 = lVar8 + 1;
      } while (AVar2 != *pAVar12);
      WVar10 = (event->xkey).root;
      uVar4 = *(undefined8 *)(targets[0] + 8 + uVar11 * 8);
      sVar13 = strlen(_glfw.x11.clipboardString);
      XChangeProperty(pDVar5,WVar10,uVar4,AVar2,8,0,pcVar6,sVar13);
LAB_0011cd78:
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0);
    XFree(targets[0]);
  }
  AVar9 = (event->xselectionrequest).property;
LAB_0011cdfb:
  local_f0[0] = 0x1f;
  local_d8 = (event->xany).display;
  local_d0 = (event->xfocus).mode;
  iStack_cc = (event->xfocus).detail;
  iStack_c8 = (event->xexpose).width;
  iStack_c4 = (event->xexpose).height;
  local_c0 = (event->xkey).time;
  local_b0 = (event->xconfigure).above;
  local_b8 = AVar9;
  XSendEvent(_glfw.x11.display,(event->xkey).root,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}